

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

uint ON_VersionNumberConstruct
               (uint major_version,uint minor_version,uint year,uint month,uint day_of_month,
               uint platform_branch)

{
  uint uVar1;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  uint platform;
  uint version_time;
  uint version_number;
  uint platform_branch_local;
  uint day_of_month_local;
  uint month_local;
  uint year_local;
  uint minor_version_local;
  uint major_version_local;
  
  local_28 = ON_VersionNumberTime(year,month,day_of_month);
  if (0xffff < local_28) {
    local_28 = 0xffff;
  }
  if (platform_branch == 0) {
    local_30 = 0;
  }
  else {
    local_30 = 2 - (platform_branch & 1);
  }
  local_2c = local_30;
  if (3 < local_30) {
    local_2c = 0;
  }
  uVar1 = ON::VersionMinorMaximum();
  month_local = minor_version;
  if (uVar1 < minor_version) {
    month_local = ON::VersionMinorMaximum();
  }
  uVar1 = ON::VersionMajorMaximum();
  year_local = major_version;
  if (uVar1 < major_version) {
    year_local = ON::VersionMajorMaximum();
  }
  uVar1 = ON::VersionMinorMaximum();
  return ((year_local * (uVar1 + 1) + month_local) * 0x10000 + local_28) * 4 + local_2c | 0x80000000
  ;
}

Assistant:

unsigned int ON_VersionNumberConstruct(
  unsigned int major_version,
  unsigned int minor_version,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int platform_branch
  )
{
  unsigned int version_number = 0;
  unsigned int version_time = ON_VersionNumberTime(year,month,day_of_month);

  if (version_time > TIME_MAX)
    version_time = TIME_MAX;

  // platform
  //   0 = developer
  //   1 = Windows Commercial/Beta/WIP
  //   2 = Mac OS Commercial/Beta/WIP
  unsigned int platform
    = (platform_branch > 0)
    ? (2 - (platform_branch % 2) )
    : 0;
  if ( platform > BRANCH_MAX )
    platform = 0; // all invalid branch numbers get mapped to "developer"
  if ( minor_version > ON::VersionMinorMaximum())
    minor_version = ON::VersionMinorMaximum();
  if ( major_version > ON::VersionMajorMaximum())
    major_version = ON::VersionMajorMaximum();
  version_number = ((major_version*(ON::VersionMinorMaximum()+1) + minor_version)*(TIME_MAX+1) + version_time)*(BRANCH_MAX+1) + platform;
  version_number |= 0x80000000;
  return version_number;
}